

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O2

int Omega_h::add_state(FiniteAutomaton *fa)

{
  int row;
  Ref pvVar1;
  int j;
  int col;
  int local_1c;
  
  row = get_nrows<int>(&fa->table);
  resize<int>(&fa->table,row + 1,(fa->table).ncols);
  for (col = 0; col < (fa->table).ncols; col = col + 1) {
    pvVar1 = at<int>(&fa->table,row,col);
    *pvVar1 = -1;
  }
  local_1c = -1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(&fa->accepted_tokens,&local_1c);
  return row;
}

Assistant:

int add_state(FiniteAutomaton& fa) {
  auto state = get_nstates(fa);
  resize(fa.table, state + 1, get_ncols(fa.table));
  for (int j = 0; j < get_ncols(fa.table); ++j) {
    at(fa.table, state, j) = -1;
  }
  fa.accepted_tokens.push_back(-1);
  return state;
}